

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::ArrayDimensionFunction::eval
          (ArrayDimensionFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  bool bVar1;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  SVInt *in_RSI;
  Type *in_RDI;
  Type *type;
  uint64_t count;
  Type *in_stack_ffffffffffffff78;
  SVInt *integer;
  Type *this_00;
  Expression *in_stack_ffffffffffffffb8;
  EvalContext *in_stack_ffffffffffffffc0;
  SystemSubroutine *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  bVar1 = SystemSubroutine::noHierarchical
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
    not_null::operator_cast_to_Type_((not_null<const_slang::ast::Type_*> *)0x91a5ab);
    while ((bVar1 = Type::isArray(in_stack_ffffffffffffff78), bVar1 &&
           (((in_RSI[3].super_SVIntStorage.bitWidth & 1) == 0 ||
            (bVar1 = Type::isUnpackedArray(in_stack_ffffffffffffff78), bVar1))))) {
      Type::getArrayElementType(this_00);
    }
    if (((in_RSI[3].super_SVIntStorage.bitWidth & 1) == 0) &&
       ((bVar1 = Type::isString((Type *)0x91a60f), !bVar1 &&
        (bVar1 = Type::isIntegral(in_RDI), bVar1)))) {
      Type::isScalar((Type *)0x91a62d);
    }
    integer = (SVInt *)&stack0xffffffffffffffb0;
    SVInt::SVInt(in_RSI,(bitwidth_t)((ulong)this_00 >> 0x20),(uint64_t)in_RDI,
                 SUB81((ulong)integer >> 0x38,0));
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,integer);
    SVInt::~SVInt(in_RSI);
  }
  else {
    slang::ConstantValue::ConstantValue((ConstantValue *)in_RDI,in_stack_ffffffffffffff78);
  }
  return (ConstantValue *)this_00;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        if (!noHierarchical(context, *args[0]))
            return nullptr;

        // Count the number of dimensions by unwrapping arrays.
        uint64_t count = 0;
        const Type* type = args[0]->type;
        while (type->isArray()) {
            if (unpackedOnly && !type->isUnpackedArray())
                break;

            count++;
            type = type->getArrayElementType();
        }

        // Strings and simple bit vectors count as a (packed) dimension.
        if (!unpackedOnly && (type->isString() || (type->isIntegral() && !type->isScalar()))) {
            count++;
        }

        return SVInt(32, count, true);
    }